

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_modSub(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  uECC_word_t uVar1;
  uECC_word_t l_borrow;
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uVar1 = uECC_vli_sub(result,left,right,num_words);
  if (uVar1 != 0) {
    uECC_vli_add(result,result,mod,num_words);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modSub(uECC_word_t *result,
                                  const uECC_word_t *left,
                                  const uECC_word_t *right,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t l_borrow = uECC_vli_sub(result, left, right, num_words);
    if (l_borrow) {
        /* In this case, result == -diff == (max int) - diff. Since -x % d == d - x,
           we can get the correct result from result + mod (with overflow). */
        uECC_vli_add(result, result, mod, num_words);
    }
}